

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIDManifest.cpp
# Opt level: O2

void Imf_3_4::(anonymous_namespace)::
     readStringList<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
               (char **readPtr,char *endPtr,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *outputVector,int numberOfStrings)

{
  const_iterator __position;
  ulong uVar1;
  uint64_t uVar2;
  InputExc *pIVar3;
  undefined4 in_register_0000000c;
  int i;
  long lVar4;
  int numberOfStrings_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> lengths;
  value_type local_50;
  
  numberOfStrings_local = 0;
  if (endPtr < *readPtr + 4) {
    pIVar3 = (InputExc *)
             __cxa_allocate_exception
                       (0x48,endPtr,outputVector,CONCAT44(in_register_0000000c,numberOfStrings));
    Iex_3_4::InputExc::InputExc(pIVar3,"IDManifest too small for string list size");
    __cxa_throw(pIVar3,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
  }
  Xdr::read<Imf_3_4::CharPtrIO,char_const*>(readPtr,&numberOfStrings_local);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&lengths,(long)numberOfStrings_local,(allocator_type *)&local_50);
  for (lVar4 = 0; uVar1 = (ulong)numberOfStrings_local, lVar4 < (long)uVar1; lVar4 = lVar4 + 1) {
    uVar2 = anon_unknown_2::readVariableLengthInteger(readPtr,endPtr);
    lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[lVar4] = uVar2;
  }
  lVar4 = 0;
  while( true ) {
    if ((int)uVar1 <= lVar4) {
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      return;
    }
    if (endPtr < *readPtr +
                 lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar4]) break;
    __position._M_current =
         (outputVector->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_insert_rval(outputVector,__position,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    *readPtr = *readPtr +
               lengths.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[lVar4];
    lVar4 = lVar4 + 1;
    uVar1 = (ulong)(uint)numberOfStrings_local;
  }
  pIVar3 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::InputExc::InputExc(pIVar3,"IDManifest too small for string");
  __cxa_throw(pIVar3,&Iex_3_4::InputExc::typeinfo,Iex_3_4::InputExc::~InputExc);
}

Assistant:

void
readStringList (
    const char*& readPtr,
    const char*  endPtr,
    T&           outputVector,
    int          numberOfStrings = 0)
{
    if (numberOfStrings == 0)
    {
        if (readPtr + 4 > endPtr)
        {
            throw IEX_NAMESPACE::InputExc (
                "IDManifest too small for string list size");
        }
        Xdr::read<CharPtrIO> (readPtr, numberOfStrings);
    }

    vector<size_t> lengths (numberOfStrings);

    for (int i = 0; i < numberOfStrings; ++i)
    {
        lengths[i] = readVariableLengthInteger (readPtr, endPtr);
    }
    for (int i = 0; i < numberOfStrings; ++i)
    {

        if (readPtr + lengths[i] > endPtr)
        {
            throw IEX_NAMESPACE::InputExc ("IDManifest too small for string");
        }
        outputVector.insert (outputVector.end (), string (readPtr, lengths[i]));
        readPtr += lengths[i];
    }
}